

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

void Dar_BalancePushUniqueOrderByLevel(Vec_Ptr_t *vStore,Aig_Obj_t *pObj,int fExor)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = vStore->nSize;
  uVar7 = (ulong)uVar5;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  do {
    if (uVar8 == uVar9) {
      Vec_PtrPush(vStore,pObj);
      uVar9 = (ulong)(uint)vStore->nSize;
      while( true ) {
        if ((int)uVar9 < 2) {
          return;
        }
        pvVar2 = vStore->pArray[uVar9 - 2];
        pvVar3 = vStore->pArray[uVar9 - 1];
        uVar5 = Aig_ObjLevel((Aig_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
        uVar6 = Aig_ObjLevel((Aig_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe));
        if (uVar5 <= uVar6) break;
        vStore->pArray[uVar9 - 1] = pvVar2;
        vStore->pArray[uVar9 - 2] = pvVar3;
        uVar9 = uVar9 - 1;
      }
      return;
    }
    ppvVar1 = vStore->pArray + uVar9;
    uVar9 = uVar9 + 1;
  } while ((Aig_Obj_t *)*ppvVar1 != pObj);
  if (fExor != 0) {
    do {
      if ((int)uVar7 < 1) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      uVar9 = uVar7 - 1;
      lVar4 = uVar7 - 1;
      uVar7 = uVar9;
    } while ((Aig_Obj_t *)vStore->pArray[lVar4] != pObj);
    while (uVar7 = uVar9 + 1, (int)uVar7 < (int)uVar5) {
      vStore->pArray[uVar9] = vStore->pArray[uVar7];
      uVar9 = uVar7;
    }
    vStore->nSize = uVar5 - 1;
  }
  return;
}

Assistant:

void Dar_BalancePushUniqueOrderByLevel( Vec_Ptr_t * vStore, Aig_Obj_t * pObj, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i;
    if ( Vec_PtrPushUnique(vStore, pObj) )
    {
        if ( fExor )
            Vec_PtrRemove(vStore, pObj);
        return;
    }
    // find the p of the node
    for ( i = vStore->nSize-1; i > 0; i-- )
    {
        pObj1 = (Aig_Obj_t *)vStore->pArray[i  ];
        pObj2 = (Aig_Obj_t *)vStore->pArray[i-1];
        if ( Aig_ObjLevel(Aig_Regular(pObj1)) <= Aig_ObjLevel(Aig_Regular(pObj2)) )
            break;
        vStore->pArray[i  ] = pObj2;
        vStore->pArray[i-1] = pObj1;
    }
}